

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O2

void opj_dump_codec(opj_codec_t *p_codec,OPJ_INT32 info_flag,FILE *output_stream)

{
  undefined4 in_register_00000034;
  
  if (p_codec != (opj_codec_t *)0x0) {
    (*(code *)p_codec[0xd])
              (p_codec[10],CONCAT44(in_register_00000034,info_flag),output_stream,p_codec[0xd]);
    return;
  }
  fwrite("[ERROR] Input parameter of the dump_codec function are incorrect.\n",0x42,1,_stderr);
  return;
}

Assistant:

void OPJ_CALLCONV opj_dump_codec(	opj_codec_t *p_codec,
									OPJ_INT32 info_flag,
									FILE* output_stream)
{
	if (p_codec) {
		opj_codec_private_t* l_codec = (opj_codec_private_t*) p_codec;

		l_codec->opj_dump_codec(l_codec->m_codec, info_flag, output_stream);
		return;
	}

	fprintf(stderr, "[ERROR] Input parameter of the dump_codec function are incorrect.\n");
	return;
}